

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O2

int __thiscall
booster::
sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::compare(sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,string_type *other)

{
  int iVar1;
  string_type local_30;
  
  str(&local_30,this);
  iVar1 = std::__cxx11::string::compare((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int compare(string_type const &other) const
		{
			return str().compare(other);
		}